

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O2

bool flatbuffers::Verify(Schema *schema,Object *root,uint8_t *buf,size_t length,uoffset_t max_depth,
                        uoffset_t max_tables)

{
  bool bVar1;
  Table *table;
  Verifier v;
  
  VerifierTemplate<false>::VerifierTemplate(&v,buf,length,max_depth,max_tables,true);
  if (buf == (uint8_t *)0x0) {
    table = (Table *)0x0;
  }
  else {
    table = (Table *)(buf + *(uint *)buf);
  }
  bVar1 = anon_unknown_94::VerifyObject(&v,schema,root,table,true);
  return bVar1;
}

Assistant:

bool Verify(const reflection::Schema &schema, const reflection::Object &root,
            const uint8_t *const buf, const size_t length,
            const uoffset_t max_depth, const uoffset_t max_tables) {
  Verifier v(buf, length, max_depth, max_tables);
  return VerifyObject(v, schema, root, flatbuffers::GetAnyRoot(buf),
                      /*required=*/true);
}